

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.h
# Opt level: O0

void __thiscall
chrono::fea::ChBeamSectionEulerSimple::SetAsRectangularSection
          (ChBeamSectionEulerSimple *this,double width_y,double width_z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double poisson;
  double b;
  double t;
  double width_z_local;
  double width_y_local;
  ChBeamSectionEulerSimple *this_local;
  undefined1 extraout_var [56];
  
  *(double *)(this + 0x38) = width_y * width_z;
  dVar1 = pow(width_y,3.0);
  *(double *)(this + 0x48) = width_z * 0.08333333333333333 * dVar1;
  dVar1 = pow(width_z,3.0);
  *(double *)(this + 0x40) = width_y * 0.08333333333333333 * dVar1;
  dVar1 = ChMin(width_y,width_z);
  dVar2 = ChMax(width_y,width_z);
  dVar3 = pow(dVar1,3.0);
  auVar4._0_8_ = pow(dVar1 / dVar2,4.0);
  auVar4._8_56_ = extraout_var;
  auVar6 = vfmadd213sd_fma(ZEXT816(0xbfb5555555555555),auVar4._0_16_,ZEXT816(0x3ff0000000000000));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = -((dVar1 / dVar2) * 0.21);
  auVar6 = vfmadd213sd_fma(auVar6,auVar5,ZEXT816(0x3fd5555555555555));
  *(double *)(this + 0x50) = dVar2 * dVar3 * auVar6._0_8_;
  dVar1 = *(double *)(this + 0x60) / (*(double *)(this + 0x58) * 2.0) - 1.0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar6 = vfmadd213sd_fma(ZEXT816(0x4026000000000000),auVar6,ZEXT816(0x4028000000000000));
  *(double *)(this + 0x70) = ((dVar1 + 1.0) * 10.0) / auVar6._0_8_;
  *(undefined8 *)(this + 0x78) = *(undefined8 *)(this + 0x70);
  ChBeamSection::SetDrawThickness((ChBeamSection *)this,width_y,width_z);
  return;
}

Assistant:

void SetAsRectangularSection(double width_y, double width_z) {
        this->Area = width_y * width_z;
        this->Izz = (1.0 / 12.0) * width_z * pow(width_y, 3);
        this->Iyy = (1.0 / 12.0) * width_y * pow(width_z, 3);

        // use Roark's formulas for torsion of rectangular sect:
        double t = ChMin(width_y, width_z);
        double b = ChMax(width_y, width_z);
        this->J = b * pow(t, 3) * ((1.0 / 3.0) - 0.210 * (t / b) * (1.0 - (1.0 / 12.0) * pow((t / b), 4)));

        // set Ks using Timoshenko-Gere formula for solid rect.shapes
        double poisson = this->E / (2.0 * this->G) - 1.0;
        this->Ks_y = 10.0 * (1.0 + poisson) / (12.0 + 11.0 * poisson);
        this->Ks_z = this->Ks_y;

        this->SetDrawThickness(width_y, width_z);
    }